

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive(JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  ScriptContext *scriptContext;
  JavascriptString *pJVar7;
  char16_t *pcVar8;
  char16_t *local_50;
  CharCount rightLength;
  CharCount leftLength;
  JavascriptString *s;
  JavascriptString *pstRight_local;
  JavascriptString *this_local;
  
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x18c,"(pstRight)","pstRight");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = IsFinalized(this);
  if (bVar2) {
    cVar4 = GetLength(this);
    cVar5 = GetLength(pstRight);
    if ((cVar4 == 0) || (cVar5 == 0)) {
      pJVar7 = ConcatDestructive_OneEmpty(this,pstRight);
      return pJVar7;
    }
    bVar2 = CompoundString::ShouldAppendChars(cVar4);
    if ((bVar2) && (bVar2 = CompoundString::ShouldAppendChars(cVar5), bVar2)) {
      pJVar7 = ConcatDestructive_CompoundAppendChars(this,pstRight);
      return pJVar7;
    }
  }
  else {
    bVar2 = VarIs<Js::CompoundString,Js::JavascriptString>(this);
    if (bVar2) {
      pJVar7 = ConcatDestructive_Compound(this,pstRight);
      return pJVar7;
    }
    bVar2 = VirtualTableInfo<Js::ConcatString>::HasVirtualTable(this);
    if ((bVar2) &&
       (pJVar7 = ConcatDestructive_ConcatToCompound(this,pstRight),
       pJVar7 != (JavascriptString *)0x0)) {
      return pJVar7;
    }
  }
  scriptContext = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  cVar4 = GetLength(this);
  cVar5 = GetLength(pstRight);
  StringProfiler::RecordConcatenation(scriptContext,cVar4,cVar5,ConcatType_ConcatTree);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
  if (bVar2) {
    bVar2 = IsFinalized(pstRight);
    if (bVar2) {
      local_50 = GetString(pstRight);
    }
    else {
      local_50 = L"";
    }
    bVar3 = IsFinalized(pstRight);
    bVar2 = true;
    if (bVar3) {
      cVar4 = GetLength(pstRight);
      bVar2 = 8 < cVar4;
    }
    pcVar8 = L"";
    if (bVar2) {
      pcVar8 = L"...";
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - creating ConcatString\n",
                  local_50,pcVar8);
    Output::Flush();
  }
  pJVar7 = (JavascriptString *)ConcatString::New(this,pstRight);
  return pJVar7;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive(JavascriptString* pstRight)
    {
        Assert(pstRight);

        if(!IsFinalized())
        {
            if(VarIs<CompoundString>(this))
            {
                return ConcatDestructive_Compound(pstRight);
            }

            if(VirtualTableInfo<ConcatString>::HasVirtualTable(this))
            {
                JavascriptString *const s = ConcatDestructive_ConcatToCompound(pstRight);
                if(s)
                {
                    return s;
                }
            }
        }
        else
        {
            const CharCount leftLength = GetLength();
            const CharCount rightLength = pstRight->GetLength();
            if(leftLength == 0 || rightLength == 0)
            {
                return ConcatDestructive_OneEmpty(pstRight);
            }

            if(CompoundString::ShouldAppendChars(leftLength) && CompoundString::ShouldAppendChars(rightLength))
            {
                return ConcatDestructive_CompoundAppendChars(pstRight);
            }
        }

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_ConcatTree);
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - creating ConcatString\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        return ConcatString::New(this, pstRight);
    }